

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsCommon.cpp
# Opt level: O0

bool helics::zeromq::bindzmqSocket
               (socket_t *socket,string *address,int port,milliseconds timeout,milliseconds period)

{
  socket_base *this;
  socklen_t in_ECX;
  sockaddr *__addr;
  socket_base *in_RDI;
  error_t *ze;
  milliseconds tcount;
  bool bindsuccess;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  undefined1 local_50 [32];
  undefined1 local_30 [11];
  byte local_25;
  socket_base *local_18;
  
  local_25 = 0;
  local_18 = in_RDI;
  memset(local_30,0,8);
  while (this = local_18, ((local_25 ^ 0xff) & 1) != 0) {
    gmlc::networking::makePortAddress(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    zmq::detail::socket_base::bind(this,(int)local_50,__addr,in_ECX);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    local_25 = 1;
  }
  return (bool)(local_25 & 1);
}

Assistant:

bool bindzmqSocket(zmq::socket_t& socket,
                   const std::string& address,
                   int port,
                   milliseconds timeout,
                   milliseconds period)
{
    bool bindsuccess = false;
    milliseconds tcount{0};
    while (!bindsuccess) {
        try {
            socket.bind(gmlc::networking::makePortAddress(address, port));
            bindsuccess = true;
        }
        catch ([[maybe_unused]] const zmq::error_t& ze) {
            if (tcount == milliseconds{0}) {
                // std::cerr << "zmq binding error on socket sleeping then will try again \n";
            }
            if (tcount > timeout) {
                break;
            }
            std::this_thread::sleep_for(period);
            tcount += period;
        }
    }
    return bindsuccess;
}